

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManCSPassiveClauseContainer.cpp
# Opt level: O1

int __thiscall
Saturation::ManCSPassiveClauseContainer::remove(ManCSPassiveClauseContainer *this,char *__filename)

{
  Clause **__src;
  pointer *pppCVar1;
  Clause **ppCVar2;
  HandlerList *pHVar3;
  int iVar4;
  __normal_iterator<Kernel::Clause_**,_std::vector<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>_>
  __dest;
  
  __dest = std::
           __find_if<__gnu_cxx::__normal_iterator<Kernel::Clause**,std::vector<Kernel::Clause*,std::allocator<Kernel::Clause*>>>,__gnu_cxx::__ops::_Iter_equals_val<Kernel::Clause*const>>
                     ((this->clauses).
                      super__Vector_base<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (this->clauses).
                      super__Vector_base<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
  __src = __dest._M_current + 1;
  ppCVar2 = (this->clauses).super__Vector_base<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (__src != ppCVar2) {
    __dest._M_current = (Clause **)memmove(__dest._M_current,__src,(long)ppCVar2 - (long)__src);
  }
  iVar4 = (int)__dest._M_current;
  pppCVar1 = &(this->clauses).
              super__Vector_base<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  *pppCVar1 = *pppCVar1 + -1;
  for (pHVar3 = (this->super_PassiveClauseContainer).super_RandomAccessClauseContainer.
                super_ClauseContainer.removedEvent.super_BaseEvent._handlers;
      pHVar3 != (HandlerList *)0x0; pHVar3 = pHVar3->_tail) {
    iVar4 = (*pHVar3->_head->_vptr_HandlerStruct[2])(pHVar3->_head,__filename);
  }
  return iVar4;
}

Assistant:

void ManCSPassiveClauseContainer::remove(Clause* cl)
{
  ASS(cl->store()==Clause::PASSIVE);

  auto it = std::find(clauses.begin(),clauses.end(),cl);
  ASS(it != clauses.end());
  clauses.erase(it);

  removedEvent.fire(cl);
  ASS(cl->store()!=Clause::PASSIVE);
}